

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O3

Sim_Man_t * Sim_ManStart(Abc_Ntk_t *pNtk,int fLightweight)

{
  uint uVar1;
  uint uVar2;
  Sim_Man_t *pSVar3;
  Vec_Ptr_t *pVVar4;
  Extra_MmFixed_t *pEVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Vec_t *pVVar9;
  void **ppvVar10;
  void *pvVar11;
  int nWords;
  ulong uVar12;
  
  pSVar3 = (Sim_Man_t *)calloc(1,0xa8);
  pSVar3->pNtk = pNtk;
  uVar1 = pNtk->vCis->nSize;
  pSVar3->nInputs = uVar1;
  pSVar3->nOutputs = pNtk->vCos->nSize;
  pSVar3->nSimBits = 0x800;
  pSVar3->nSimWords = 0x40;
  pVVar4 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
  pSVar3->vSim0 = pVVar4;
  pSVar3->fLightweight = fLightweight;
  if (fLightweight == 0) {
    ppvVar10 = (void **)0x0;
    pVVar4 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
    pSVar3->vSim1 = pVVar4;
    uVar2 = pNtk->vCis->nSize;
    pSVar3->nSuppBits = uVar2;
    nWords = (((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0);
    pSVar3->nSuppWords = nWords;
    pVVar4 = Sim_ComputeStrSupp(pNtk);
    pSVar3->vSuppStr = pVVar4;
    pVVar4 = Sim_UtilInfoAlloc(pNtk->vCos->nSize,nWords,1);
    pSVar3->vSuppFun = pVVar4;
    pEVar5 = Extra_MmFixedStart(nWords * 4 + 0x10);
    pSVar3->pMmPat = pEVar5;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    pVVar4->pArray = ppvVar6;
    pSVar3->vFifo = pVVar4;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    pVVar7->nCap = 100;
    pVVar7->nSize = 0;
    piVar8 = (int *)malloc(400);
    pVVar7->pArray = piVar8;
    pSVar3->vDiffs = pVVar7;
    pVVar9 = (Vec_Vec_t *)malloc(0x10);
    uVar2 = 8;
    if (6 < uVar1 - 1) {
      uVar2 = uVar1;
    }
    pVVar9->nCap = uVar2;
    if (uVar2 != 0) {
      ppvVar10 = (void **)malloc((long)(int)uVar2 << 3);
    }
    pVVar9->pArray = ppvVar10;
    if (0 < (int)uVar1) {
      uVar12 = 0;
      do {
        pvVar11 = calloc(1,0x10);
        ppvVar10[uVar12] = pvVar11;
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
    }
    pVVar9->nSize = uVar1;
    pSVar3->vSuppTargs = pVVar9;
  }
  return pSVar3;
}

Assistant:

Sim_Man_t * Sim_ManStart( Abc_Ntk_t * pNtk, int fLightweight )
{
    Sim_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Sim_Man_t, 1 );
    memset( p, 0, sizeof(Sim_Man_t) );
    p->pNtk = pNtk;
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimBits   = 2048;
    p->nSimWords  = SIM_NUM_WORDS(p->nSimBits);
    p->vSim0      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    p->fLightweight = fLightweight;
    if (!p->fLightweight) {
        p->vSim1      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
        // support information
        p->nSuppBits  = Abc_NtkCiNum(pNtk);
        p->nSuppWords = SIM_NUM_WORDS(p->nSuppBits);
        p->vSuppStr   = Sim_ComputeStrSupp( pNtk );
        p->vSuppFun   = Sim_UtilInfoAlloc( Abc_NtkCoNum(p->pNtk),  p->nSuppWords, 1 );
        // other data
        p->pMmPat     = Extra_MmFixedStart( sizeof(Sim_Pat_t) + p->nSuppWords * sizeof(unsigned) ); 
        p->vFifo      = Vec_PtrAlloc( 100 );
        p->vDiffs     = Vec_IntAlloc( 100 );
        // allocate support targets (array of unresolved outputs for each input)
        p->vSuppTargs = Vec_VecStart( p->nInputs );
    }
    return p;
}